

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O3

void kmlyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  pdVar1 = p->mix_coef;
  *pdVar1 = 1.0 - dVar2;
  pdVar1[1] = 1.0 - dVar3;
  pdVar1[2] = dVar3;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
kmlyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ac;

  assert(p != NULL);

  a0 = get_ext_param(p, ext_params, 0);
  ac = get_ext_param(p, ext_params, 1);

  p->mix_coef[0] = 1.0 - a0;
  p->mix_coef[1] = 1.0 - ac;
  p->mix_coef[2] = ac;

  p->cam_alpha = a0;

}